

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_conversation.cpp
# Opt level: O3

bool __thiscall DConversationMenu::Responder(DConversationMenu *this,event_t *ev)

{
  BYTE BVar1;
  short sVar2;
  bool bVar3;
  short sVar4;
  int iVar5;
  _func_int **pp_Var6;
  ulong uVar7;
  undefined8 uVar8;
  
  if (demoplayback) {
    return false;
  }
  if ((ev->type == '\x04') && (ev->subtype == '\x04')) {
    sVar2 = ev->data1;
    if ((ushort)(sVar2 - 0x30U) < 10) {
      sVar4 = 9;
      if (sVar2 != 0x30) {
        sVar4 = sVar2 + -0x31;
      }
      mSelection = (int)sVar4;
      iVar5 = (*(this->super_DMenu).super_DObject._vptr_DObject[8])(this,6,0);
      return SUB41(iVar5,0);
    }
    bVar3 = DMenu::Responder(&this->super_DMenu,ev);
    return bVar3;
  }
  if (ev->type != '\x04') {
    return false;
  }
  BVar1 = ev->subtype;
  if (BVar1 == '\x06') {
    BackbuttonTime = 0x8c;
    if (((this->super_DMenu).super_DObject.field_0x24 == '\0') && (m_use_mouse.Value != 1)) {
      BackbuttonTime = 0x8c;
      return false;
    }
    bVar3 = DMenu::MouseEventBack(&this->super_DMenu,1,(int)ev->data1,(int)ev->data2);
    if (bVar3) {
      ev->data2 = -1;
      uVar7 = 0xffffffff;
    }
    else {
      uVar7 = (ulong)(uint)(int)ev->data2;
    }
    sVar2 = ev->data1;
    pp_Var6 = (this->super_DMenu).super_DObject._vptr_DObject;
    uVar8 = 1;
  }
  else {
    if (BVar1 != '\b') {
      if (BVar1 != '\a') {
        return false;
      }
      bVar3 = DMenu::MouseEventBack(&this->super_DMenu,0,(int)ev->data1,(int)ev->data2);
      if (bVar3) {
        ev->data2 = -1;
        uVar7 = 0xffffffff;
      }
      else {
        uVar7 = (ulong)(uint)(int)ev->data2;
      }
      iVar5 = (*(this->super_DMenu).super_DObject._vptr_DObject[0xe])
                        (this,0,(ulong)(uint)(int)ev->data1,uVar7);
      if ((byte)(bVar3 | (byte)iVar5) != 1) {
        return false;
      }
      if ((this->super_DMenu).super_DObject.field_0x24 != '\0') {
        return false;
      }
      (this->super_DMenu).super_DObject.field_0x24 = 1;
      I_SetMouseCapture();
      return false;
    }
    if ((this->super_DMenu).super_DObject.field_0x24 != '\x01') {
      return false;
    }
    (this->super_DMenu).super_DObject.field_0x24 = 0;
    I_ReleaseMouseCapture();
    bVar3 = DMenu::MouseEventBack(&this->super_DMenu,2,(int)ev->data1,(int)ev->data2);
    if (bVar3) {
      ev->data2 = -1;
      uVar7 = 0xffffffff;
    }
    else {
      uVar7 = (ulong)(uint)(int)ev->data2;
    }
    sVar2 = ev->data1;
    pp_Var6 = (this->super_DMenu).super_DObject._vptr_DObject;
    uVar8 = 2;
  }
  (*pp_Var6[0xe])(this,uVar8,(ulong)(uint)(int)sVar2,uVar7);
  return false;
}

Assistant:

bool Responder(event_t *ev)
	{
		if (demoplayback)
		{ // No interaction during demo playback
			return false;
		}
		if (ev->type == EV_GUI_Event && ev->subtype == EV_GUI_Char && ev->data1 >= '0' && ev->data1 <= '9')
		{ // Activate an item of type numberedmore (dialogue only)
			mSelection = ev->data1 == '0' ? 9 : ev->data1 - '1';
			return MenuEvent(MKEY_Enter, false);
		}
		return Super::Responder(ev);
	}